

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O1

void duckdb::
     LeastGreatestFunction<duckdb::string_t,duckdb::GreaterThan,duckdb::SortKeyLeastGreatest>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  undefined8 *puVar1;
  string_t *psVar2;
  Vector *pVVar3;
  long lVar4;
  optional_ptr<duckdb::FunctionLocalState,_true> oVar5;
  bool bVar6;
  DataChunk *this;
  reference pvVar7;
  ulong uVar8;
  size_type sVar9;
  string_t *psVar10;
  ulong uVar11;
  string_t ivalue;
  UnifiedVectorFormat vdata;
  bool result_has_value [2048];
  anon_union_16_2_67f50693_for_value local_8a8;
  ExpressionState *local_890;
  Vector *local_888;
  long *local_880;
  long local_878;
  long local_870;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_860;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_840;
  optional_ptr<duckdb::FunctionLocalState,_true> local_838 [257];
  
  if (*(long *)(args + 8) - *(long *)args == 0x68) {
    vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
    duckdb::Vector::Reference(result);
    return;
  }
  local_888 = result;
  this = SortKeyLeastGreatest::Prepare(args,state);
  local_838[0].ptr = *(FunctionLocalState **)(state + 0xb0);
  local_890 = state;
  optional_ptr<duckdb::FunctionLocalState,_true>::CheckValid(local_838);
  oVar5.ptr = local_838[0].ptr;
  if (*(long *)(this + 8) != *(long *)this) {
    sVar9 = 0;
    do {
      vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,sVar9);
      sVar9 = sVar9 + 1;
    } while (sVar9 < (ulong)((*(long *)(this + 8) - *(long *)this >> 3) * 0x4ec4ec4ec4ec4ec5));
  }
  psVar2 = *(string_t **)(oVar5.ptr + 0x68);
  memset(local_838,0,0x800);
  if (*(long *)(this + 8) != *(long *)this) {
    sVar9 = 0;
    do {
      pvVar7 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)this,sVar9);
      if (*pvVar7 == (value_type)0x2) {
        pvVar7 = vector<duckdb::Vector,_true>::operator[]
                           ((vector<duckdb::Vector,_true> *)this,sVar9);
        if ((*(byte **)(pvVar7 + 0x28) == (byte *)0x0) || ((**(byte **)(pvVar7 + 0x28) & 1) != 0))
        goto LAB_0067a191;
      }
      else {
LAB_0067a191:
        duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_880);
        pvVar7 = vector<duckdb::Vector,_true>::operator[]
                           ((vector<duckdb::Vector,_true> *)this,sVar9);
        duckdb::Vector::ToUnifiedFormat((ulong)pvVar7,*(UnifiedVectorFormat **)(this + 0x18));
        lVar4 = local_878;
        if (local_870 == 0) {
          if (*(long *)(this + 0x18) != 0) {
            uVar11 = 0;
            psVar10 = psVar2;
            do {
              uVar8 = uVar11;
              if (*local_880 != 0) {
                uVar8 = (ulong)*(uint *)(*local_880 + uVar11 * 4);
              }
              puVar1 = (undefined8 *)(lVar4 + uVar8 * 0x10);
              local_8a8._0_8_ = *puVar1;
              local_8a8.pointer.ptr = (char *)puVar1[1];
              if ((*(char *)((long)&local_838[0].ptr + uVar11) != '\x01') ||
                 (bVar6 = string_t::StringComparisonOperators::GreaterThan
                                    ((string_t *)&local_8a8.pointer,psVar10), bVar6)) {
                *(undefined1 *)((long)&local_838[0].ptr + uVar11) = 1;
                *(undefined8 *)&psVar10->value = local_8a8._0_8_;
                (psVar10->value).pointer.ptr = local_8a8.pointer.ptr;
              }
              uVar11 = uVar11 + 1;
              psVar10 = psVar10 + 1;
            } while (uVar11 < *(ulong *)(this + 0x18));
          }
        }
        else if (*(long *)(this + 0x18) != 0) {
          uVar11 = 0;
          psVar10 = psVar2;
          do {
            uVar8 = uVar11;
            if (*local_880 != 0) {
              uVar8 = (ulong)*(uint *)(*local_880 + uVar11 * 4);
            }
            if ((local_870 == 0) ||
               ((*(ulong *)(local_870 + (uVar8 >> 6) * 8) >> (uVar8 & 0x3f) & 1) != 0)) {
              puVar1 = (undefined8 *)(lVar4 + uVar8 * 0x10);
              local_8a8._0_8_ = *puVar1;
              local_8a8.pointer.ptr = (char *)puVar1[1];
              if ((*(char *)((long)&local_838[0].ptr + uVar11) != '\x01') ||
                 (bVar6 = string_t::StringComparisonOperators::GreaterThan
                                    ((string_t *)&local_8a8.pointer,psVar10), bVar6)) {
                *(undefined1 *)((long)&local_838[0].ptr + uVar11) = 1;
                *(undefined8 *)&psVar10->value = local_8a8._0_8_;
                (psVar10->value).pointer.ptr = local_8a8.pointer.ptr;
              }
            }
            uVar11 = uVar11 + 1;
            psVar10 = psVar10 + 1;
          } while (uVar11 < *(ulong *)(this + 0x18));
        }
        if (local_840 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_840);
        }
        if (local_860 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_860);
        }
      }
      sVar9 = sVar9 + 1;
    } while (sVar9 < (ulong)((*(long *)(this + 8) - *(long *)this >> 3) * 0x4ec4ec4ec4ec4ec5));
  }
  pVVar3 = local_888;
  SortKeyLeastGreatest::FinalizeResult
            (*(idx_t *)(this + 0x18),(bool *)local_838,local_888,local_890);
  duckdb::Vector::SetVectorType((VectorType)pVVar3);
  return;
}

Assistant:

static void LeastGreatestFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	if (args.ColumnCount() == 1) {
		// single input: nop
		result.Reference(args.data[0]);
		return;
	}
	auto &input = BASE_OP::Prepare(args, state);
	auto &result_vector = BASE_OP::TargetVector(result, state);

	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (args.data[col_idx].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			// non-constant input: result is not a constant vector
			result_type = VectorType::FLAT_VECTOR;
		}
		if (BASE_OP::IS_STRING) {
			// for string vectors we add a reference to the heap of the children
			StringVector::AddHeapReference(result_vector, input.data[col_idx]);
		}
	}

	auto result_data = FlatVector::GetData<T>(result_vector);
	bool result_has_value[STANDARD_VECTOR_SIZE] {false};
	// perform the operation column-by-column
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (input.data[col_idx].GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    ConstantVector::IsNull(input.data[col_idx])) {
			// ignore null vector
			continue;
		}

		UnifiedVectorFormat vdata;
		input.data[col_idx].ToUnifiedFormat(input.size(), vdata);

		auto input_data = UnifiedVectorFormat::GetData<T>(vdata);
		if (!vdata.validity.AllValid()) {
			// potential new null entries: have to check the null mask
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);
				if (vdata.validity.RowIsValid(vindex)) {
					// not a null entry: perform the operation and add to new set
					auto ivalue = input_data[vindex];
					if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
						result_has_value[i] = true;
						result_data[i] = ivalue;
					}
				}
			}
		} else {
			// no new null entries: only need to perform the operation
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);

				auto ivalue = input_data[vindex];
				if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
					result_has_value[i] = true;
					result_data[i] = ivalue;
				}
			}
		}
	}
	BASE_OP::FinalizeResult(input.size(), result_has_value, result, state);
	result.SetVectorType(result_type);
}